

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.h
# Opt level: O0

void __thiscall ZXing::Result::Result(Result *this)

{
  Content *in_RDI;
  Error *in_stack_ffffffffffffffb0;
  pointer *local_48;
  undefined1 *local_38;
  
  ZXing::Content::Content(in_RDI);
  Error::Error(in_stack_ffffffffffffffb0);
  Quadrilateral<ZXing::PointT<int>_>::Quadrilateral((Quadrilateral<ZXing::PointT<int>_> *)0x136841);
  ReaderOptions::ReaderOptions((ReaderOptions *)0x136852);
  StructuredAppendInfo::StructuredAppendInfo((StructuredAppendInfo *)0x136865);
  *(undefined4 *)
   &in_RDI[3].encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  local_38 = (undefined1 *)
             ((long)&in_RDI[3].encodings.
                     super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
  do {
    *local_38 = 0;
    local_38 = local_38 + 1;
  } while ((pointer *)local_38 !=
           &in_RDI[3].encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_finish);
  local_48 = &in_RDI[3].encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  do {
    *(undefined1 *)local_48 = 0;
    local_48 = (pointer *)((long)local_48 + 1);
  } while (local_48 !=
           (pointer *)
           ((long)&in_RDI[3].encodings.
                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4));
  *(undefined4 *)
   ((long)&in_RDI[3].encodings.
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined1 *)
   &in_RDI[3].encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&in_RDI[3].encodings.
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[3].encodings.
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  return;
}

Assistant:

Result() = default;